

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

bool cmHexFileConverter::TryConvert(char *inFileName,char *outFileName)

{
  FILE *pFVar1;
  char *pcVar2;
  char local_498 [8];
  char buf [1024];
  undefined1 local_90 [6];
  bool success;
  FILE *local_70;
  FILE *outFile;
  allocator<char> local_51;
  string local_50;
  FILE *local_30;
  FILE *inFile;
  char *pcStack_20;
  FileType type;
  char *outFileName_local;
  char *inFileName_local;
  
  pcStack_20 = outFileName;
  outFileName_local = inFileName;
  inFile._4_4_ = DetermineFileType(inFileName);
  pcVar2 = outFileName_local;
  if (inFile._4_4_ == Binary) {
    inFileName_local._7_1_ = false;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar2,&local_51);
    pFVar1 = (FILE *)cmsys::SystemTools::Fopen(&local_50,"rb");
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    pcVar2 = pcStack_20;
    local_30 = pFVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,pcVar2,(allocator<char> *)(buf + 0x3ff));
    pFVar1 = (FILE *)cmsys::SystemTools::Fopen((string *)local_90,"wb");
    std::__cxx11::string::~string((string *)local_90);
    std::allocator<char>::~allocator((allocator<char> *)(buf + 0x3ff));
    local_70 = pFVar1;
    if ((local_30 == (FILE *)0x0) || (pFVar1 == (FILE *)0x0)) {
      if (local_30 != (FILE *)0x0) {
        fclose(local_30);
      }
      if (local_70 != (FILE *)0x0) {
        fclose(local_70);
      }
      inFileName_local._7_1_ = false;
    }
    else {
      buf[0x3fe] = '\0';
      do {
        pcVar2 = fgets(local_498,0x400,local_30);
        if (pcVar2 == (char *)0x0) break;
        if (inFile._4_4_ == MotorolaSrec) {
          buf[0x3fe] = ConvertMotorolaSrecLine(local_498,(FILE *)local_70);
        }
        else if (inFile._4_4_ == IntelHex) {
          buf[0x3fe] = ConvertIntelHexLine(local_498,(FILE *)local_70);
        }
      } while ((buf[0x3fe] & 1U) != 0);
      fclose(local_30);
      fclose(local_70);
      inFileName_local._7_1_ = (bool)(buf[0x3fe] & 1);
    }
  }
  return inFileName_local._7_1_;
}

Assistant:

bool cmHexFileConverter::TryConvert(const char* inFileName,
                                    const char* outFileName)
{
  FileType type = DetermineFileType(inFileName);
  if (type == Binary) {
    return false;
  }

  // try to open the file
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  FILE* outFile = cmsys::SystemTools::Fopen(outFileName, "wb");
  if ((inFile == nullptr) || (outFile == nullptr)) {
    if (inFile != nullptr) {
      fclose(inFile);
    }
    if (outFile != nullptr) {
      fclose(outFile);
    }
    return false;
  }

  // convert them line by line
  bool success = false;
  char buf[1024];
  while (fgets(buf, 1024, inFile) != nullptr) {
    if (type == MotorolaSrec) {
      success = ConvertMotorolaSrecLine(buf, outFile);
    } else if (type == IntelHex) {
      success = ConvertIntelHexLine(buf, outFile);
    }
    if (!success) {
      break;
    }
  }

  // close them again
  fclose(inFile);
  fclose(outFile);
  return success;
}